

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall Fl_Text_Display::draw_line_numbers(Fl_Text_Display *this,bool param_1)

{
  int h;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint local_60;
  uint local_5c;
  char lineNumString [16];
  
  h = this->mMaxsize;
  iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
  if (0 < this->mLineNumWidth) {
    iVar4 = Fl_Widget::visible_r((Fl_Widget *)this);
    if (iVar4 != 0) {
      uVar7 = 0;
      if (((this->mHScrollBar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0)
      {
        uVar7 = (this->mHScrollBar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.h_;
      }
      iVar4 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
      iVar5 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
      iVar5 = (-(this->scrollbar_align_ & 1) & uVar7) + iVar5;
      if (iVar3 == 0) {
        local_60 = fl_inactive(8);
        local_5c = fl_inactive(0x35);
      }
      else {
        local_5c = 0x35;
        local_60 = 8;
      }
      iVar3 = (this->super_Fl_Group).super_Fl_Widget.x_;
      iVar1 = (this->super_Fl_Group).super_Fl_Widget.y_;
      iVar2 = (this->super_Fl_Group).super_Fl_Widget.h_;
      uVar8 = this->mLineNumWidth;
      iVar6 = Fl::box_dw((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,(ulong)(uint)(iVar3 + iVar4),(ulong)(uint)(iVar1 + iVar5),
                 (ulong)uVar8,(ulong)(iVar2 - (uVar7 + iVar6)));
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)local_5c);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)(uint)((this->super_Fl_Group).super_Fl_Widget.x_ + iVar4)
                 ,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.y_,
                 (ulong)(uint)this->mLineNumWidth,
                 (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.h_);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
                (fl_graphics_driver,0,(ulong)(uint)FL_NORMAL_SIZE);
      iVar3 = (this->super_Fl_Group).super_Fl_Widget.y_;
      uVar7 = get_absolute_top_line_number(this);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)local_60);
      iVar3 = iVar3 + iVar5 + 3;
      for (lVar9 = 0; lVar9 < this->mNVisibleLines; lVar9 = lVar9 + 1) {
        iVar5 = this->mLineStarts[lVar9];
        if (iVar5 == -1) {
LAB_001d0abf:
          uVar8 = (uint)(lVar9 == 0);
        }
        else {
          if (iVar5 != 0) {
            uVar8 = Fl_Text_Buffer::char_at(this->mBuffer,iVar5 + -1);
            if (uVar8 != 10) goto LAB_001d0abf;
          }
          sprintf(lineNumString,"%d",(ulong)uVar7);
          fl_draw(lineNumString,(this->super_Fl_Group).super_Fl_Widget.x_ + iVar4 + 3,iVar3,
                  this->mLineNumWidth + -6,h,8,(Fl_Image *)0x0,0);
          uVar8 = 1;
        }
        uVar7 = uVar7 + uVar8;
        iVar3 = iVar3 + h;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    }
  }
  return;
}

Assistant:

void Fl_Text_Display::draw_line_numbers(bool /*clearAll*/) {
  int Y, line, visLine, lineStart;
  char lineNumString[16];
  int lineHeight = mMaxsize;
  int isactive = active_r() ? 1 : 0;

  // Don't draw if lineNumWidth == 0 (line numbers are hidden),
  // or widget is not yet realized
  if (mLineNumWidth <= 0 || !visible_r())
    return;

  // Make sure we set the correct clipping range for line numbers.
  // Take scrollbars and positions into account.
  int hscroll_h = mHScrollBar->visible() ? mHScrollBar->h() : 0;
  int xoff = Fl::box_dx(box());
  int yoff = Fl::box_dy(box()) + ((scrollbar_align()&FL_ALIGN_TOP)?hscroll_h:0);

#ifndef LINENUM_LEFT_OF_VSCROLL
  int vscroll_w = mVScrollBar->visible() ? mVScrollBar->w() : 0;
  if (scrollbar_align()&FL_ALIGN_LEFT)
    xoff += vscroll_w;
#endif

  Fl_Color fgcolor = isactive ? linenumber_fgcolor() : fl_inactive(linenumber_fgcolor());
  Fl_Color bgcolor = isactive ? linenumber_bgcolor() : fl_inactive(linenumber_bgcolor());
  fl_push_clip(x() + xoff,
               y() + yoff,
               mLineNumWidth,
               h() - Fl::box_dw(box()) - hscroll_h);
  {
    // Set background color for line number area -- LZA / STR# 2621
    // Erase background
    fl_color(bgcolor);
    fl_rectf(x()+xoff, y(), mLineNumWidth, h());

    // Draw separator line
    //fl_color(180,180,180);
    //fl_line(x()+mLineNumWidth-1, y(), x()+mLineNumWidth-1, y()+h());

    // Draw line number text
    fl_font(linenumber_font(), linenumber_size());

    Y = y() + yoff;
    line = get_absolute_top_line_number();

    // set font color for line numbers
    fl_color(fgcolor);
    for (visLine=0; visLine < mNVisibleLines; visLine++) {
      lineStart = mLineStarts[visLine];
      if (lineStart != -1 && (lineStart==0 || buffer()->char_at(lineStart-1)=='\n')) {
	sprintf(lineNumString, linenumber_format(), line);
	int xx = x() + xoff + 3,
	    yy = Y + 3,
	    ww = mLineNumWidth - (3*2),
	    hh = lineHeight;
	fl_draw(lineNumString, xx, yy, ww, hh, linenumber_align(), 0, 0);
	//DEBUG fl_rect(xx, yy, ww, hh);
	line++;
      } else {
	if (visLine == 0) line++;
      }
      Y += lineHeight;
    }
  } 
  fl_pop_clip();
}